

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Refal2::CParser::parsingDirective(CParser *this)

{
  TParsingElementState TVar1;
  
  CDirectiveParser::AddToken(&this->super_CDirectiveParser);
  TVar1 = (this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.
          super_CParsingElementState.state;
  if (TVar1 == PES_Wrong) {
    this->state = (TState)parsingIgnoreLine;
    *(undefined8 *)&this->field_0x1f68 = 0;
    if ((this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type !=
        TT_LineFeed) {
      return;
    }
  }
  else if (TVar1 != PES_Correct) {
    return;
  }
  this->state = (TState)parsingInitial;
  *(undefined8 *)&this->field_0x1f68 = 0;
  return;
}

Assistant:

void CParser::parsingDirective()
{
	CDirectiveParser::AddToken();
	checkFinished();
}